

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_linearsolver.c
# Opt level: O1

sunrealtype SUNLinSolResNorm(SUNLinearSolver S)

{
  _func_sunrealtype_SUNLinearSolver *UNRECOVERED_JUMPTABLE;
  sunrealtype sVar1;
  
  UNRECOVERED_JUMPTABLE = S->ops->resnorm;
  if (UNRECOVERED_JUMPTABLE != (_func_sunrealtype_SUNLinearSolver *)0x0) {
    sVar1 = (*UNRECOVERED_JUMPTABLE)(S);
    return sVar1;
  }
  return 0.0;
}

Assistant:

sunrealtype SUNLinSolResNorm(SUNLinearSolver S)
{
  sunrealtype result;
  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(S));
  if (S->ops->resnorm) { result = S->ops->resnorm(S); }
  else { result = SUN_RCONST(0.0); }
  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(S));
  return (result);
}